

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

int arith_decode(j_decompress_ptr cinfo,uchar *st)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  byte *in_RSI;
  long in_RDI;
  int data;
  int sv;
  JLONG temp;
  JLONG qe;
  uchar nm;
  uchar nl;
  arith_entropy_ptr_conflict e;
  int local_38;
  uint local_34;
  j_decompress_ptr in_stack_ffffffffffffffd0;
  
  lVar2 = *(long *)(in_RDI + 0x250);
  while (*(long *)(lVar2 + 0x20) < 0x8000) {
    iVar5 = *(int *)(lVar2 + 0x28) + -1;
    *(int *)(lVar2 + 0x28) = iVar5;
    if (iVar5 < 0) {
      if (*(int *)(in_RDI + 0x21c) == 0) {
        local_38 = get_byte(in_stack_ffffffffffffffd0);
        if (local_38 == 0xff) {
          do {
            iVar5 = get_byte(in_stack_ffffffffffffffd0);
          } while (iVar5 == 0xff);
          if (iVar5 == 0) {
            local_38 = 0xff;
          }
          else {
            *(int *)(in_RDI + 0x21c) = iVar5;
            local_38 = 0;
          }
        }
      }
      else {
        local_38 = 0;
      }
      *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x18) << 8 | (long)local_38;
      iVar5 = *(int *)(lVar2 + 0x28) + 8;
      *(int *)(lVar2 + 0x28) = iVar5;
      if ((iVar5 < 0) &&
         (iVar5 = *(int *)(lVar2 + 0x28) + 1, *(int *)(lVar2 + 0x28) = iVar5, iVar5 == 0)) {
        *(undefined8 *)(lVar2 + 0x20) = 0x8000;
      }
    }
    *(long *)(lVar2 + 0x20) = *(long *)(lVar2 + 0x20) << 1;
  }
  bVar1 = *in_RSI;
  local_34 = (uint)bVar1;
  lVar3 = jpeg_aritab[(int)(local_34 & 0x7f)];
  bVar4 = (byte)((ulong)lVar3 >> 8);
  lVar6 = lVar3 >> 0x10;
  lVar7 = *(long *)(lVar2 + 0x20) - lVar6;
  *(long *)(lVar2 + 0x20) = lVar7;
  lVar7 = lVar7 << ((byte)*(undefined4 *)(lVar2 + 0x28) & 0x3f);
  if (*(long *)(lVar2 + 0x18) < lVar7) {
    if (*(long *)(lVar2 + 0x20) < 0x8000) {
      if (*(long *)(lVar2 + 0x20) < lVar6) {
        *in_RSI = bVar1 & 0x80 ^ (byte)lVar3;
        local_34 = local_34 ^ 0x80;
      }
      else {
        *in_RSI = bVar1 & 0x80 ^ bVar4;
      }
    }
  }
  else {
    *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x18) - lVar7;
    if (*(long *)(lVar2 + 0x20) < lVar6) {
      *(long *)(lVar2 + 0x20) = lVar6;
      *in_RSI = bVar1 & 0x80 ^ bVar4;
    }
    else {
      *(long *)(lVar2 + 0x20) = lVar6;
      *in_RSI = bVar1 & 0x80 ^ (byte)lVar3;
      local_34 = local_34 ^ 0x80;
    }
  }
  return (int)local_34 >> 7;
}

Assistant:

LOCAL(int)
arith_decode(j_decompress_ptr cinfo, unsigned char *st)
{
  register arith_entropy_ptr e = (arith_entropy_ptr)cinfo->entropy;
  register unsigned char nl, nm;
  register JLONG qe, temp;
  register int sv, data;

  /* Renormalization & data input per section D.2.6 */
  while (e->a < 0x8000L) {
    if (--e->ct < 0) {
      /* Need to fetch next data byte */
      if (cinfo->unread_marker)
        data = 0;               /* stuff zero data */
      else {
        data = get_byte(cinfo); /* read next input byte */
        if (data == 0xFF) {     /* zero stuff or marker code */
          do data = get_byte(cinfo);
          while (data == 0xFF); /* swallow extra 0xFF bytes */
          if (data == 0)
            data = 0xFF;        /* discard stuffed zero byte */
          else {
            /* Note: Different from the Huffman decoder, hitting
             * a marker while processing the compressed data
             * segment is legal in arithmetic coding.
             * The convention is to supply zero data
             * then until decoding is complete.
             */
            cinfo->unread_marker = data;
            data = 0;
          }
        }
      }
      e->c = (e->c << 8) | data; /* insert data into C register */
      if ((e->ct += 8) < 0)      /* update bit shift counter */
        /* Need more initial bytes */
        if (++e->ct == 0)
          /* Got 2 initial bytes -> re-init A and exit loop */
          e->a = 0x8000L; /* => e->a = 0x10000L after loop exit */
    }
    e->a <<= 1;
  }

  /* Fetch values from our compact representation of Table D.2:
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];  /* => Qe_Value */
  nl = qe & 0xFF;  qe >>= 8;    /* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF;  qe >>= 8;    /* Next_Index_MPS */

  /* Decode & estimation procedures per sections D.2.4 & D.2.5 */
  temp = e->a - qe;
  e->a = temp;
  temp <<= e->ct;
  if (e->c >= temp) {
    e->c -= temp;
    /* Conditional LPS (less probable symbol) exchange */
    if (e->a < qe) {
      e->a = qe;
      *st = (sv & 0x80) ^ nm;   /* Estimate_after_MPS */
    } else {
      e->a = qe;
      *st = (sv & 0x80) ^ nl;   /* Estimate_after_LPS */
      sv ^= 0x80;               /* Exchange LPS/MPS */
    }
  } else if (e->a < 0x8000L) {
    /* Conditional MPS (more probable symbol) exchange */
    if (e->a < qe) {
      *st = (sv & 0x80) ^ nl;   /* Estimate_after_LPS */
      sv ^= 0x80;               /* Exchange LPS/MPS */
    } else {
      *st = (sv & 0x80) ^ nm;   /* Estimate_after_MPS */
    }
  }

  return sv >> 7;
}